

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

void __thiscall QVariant::load(QVariant *this,QDataStream *s)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  uint uVar4;
  QMetaType *this_00;
  QMetaType QVar5;
  ulong uVar6;
  storage_type *extraout_RDX;
  storage_type *extraout_RDX_00;
  QVariant *data;
  char *pcVar7;
  long in_FS_OFFSET;
  QByteArrayView typeName;
  QByteArrayView typeName_00;
  QMessageLogger local_68;
  QArrayDataPointer<char> local_48;
  qint8 is_null;
  quint32 typeId;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  typeId = 0xaaaaaaaa;
  QDataStream::operator>>(s,(qint32 *)&typeId);
  uVar4 = s->ver;
  if ((int)uVar4 < 7) {
    if (0x23 < (ulong)typeId) goto LAB_002a3d7a;
    typeId = (quint32)mapIdFromQt3ToCurrent[typeId];
LAB_002a3b49:
    if (typeId == 0x400) {
LAB_002a3b51:
      typeId = 0x10000;
    }
    else {
LAB_002a3b75:
      if (typeId - 0x40 < 0x18) {
        typeId = typeId + 0xfc0;
      }
      else if (typeId == 0x1b) {
        this_00 = (QMetaType *)QByteArrayView::lengthHelperCharArray("QRegExp",8);
        typeName.m_data = extraout_RDX;
        typeName.m_size = (qsizetype)"QRegExp";
        QVar5 = QMetaType::fromName(this_00,typeName);
        local_68.context.version = (int)QVar5.d_ptr;
        local_68.context.line = (int)((ulong)QVar5.d_ptr >> 0x20);
        typeId = QMetaType::registerHelper((QMetaType *)&local_68);
        uVar4 = s->ver;
      }
      else if (typeId == 0x79) goto LAB_002a3b93;
    }
LAB_002a3bcd:
    is_null = '\0';
    if (7 < (int)uVar4) goto LAB_002a3bd7;
  }
  else {
    if (uVar4 < 0xd) {
      if (typeId == 0x7f) goto LAB_002a3b51;
      if (typeId != 0x400 && 0x7f < typeId) {
        typeId = typeId - 0x61;
        goto LAB_002a3b49;
      }
      if (typeId != 0x4b) {
        if (10 < typeId - 0x4c) goto LAB_002a3b49;
        typeId = typeId - 1;
        goto LAB_002a3b75;
      }
LAB_002a3b93:
      typeId = 0x2000;
      goto LAB_002a3bcd;
    }
    if (uVar4 < 0x14) goto LAB_002a3b49;
LAB_002a3bd7:
    is_null = '\0';
    QDataStream::operator>>(s,&is_null);
  }
  if (typeId == 0x10000) {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char *)0x0;
    local_48.size = 0;
    ::operator>>(s,(QByteArray *)&local_48);
    typeName_00.m_data = extraout_RDX_00;
    typeName_00.m_size = (qsizetype)local_48.ptr;
    QVar5 = QMetaType::fromName((QMetaType *)local_48.size,typeName_00);
    local_68.context.version = (int)QVar5.d_ptr;
    local_68.context.line = (int)((ulong)QVar5.d_ptr >> 0x20);
    typeId = QMetaType::registerHelper((QMetaType *)&local_68);
    if (typeId == 0) {
      QDataStream::setStatus(s,ReadCorruptData);
      local_68.context.version = 2;
      local_68.context.line = 0;
      local_68.context.file._0_4_ = 0;
      local_68.context.file._4_4_ = 0;
      local_68.context.function._0_4_ = 0;
      local_68.context.function._4_4_ = 0;
      local_68.context.category = "default";
      pcVar7 = local_48.ptr;
      if (local_48.ptr == (char *)0x0) {
        pcVar7 = &QByteArray::_empty;
      }
      QMessageLogger::warning(&local_68,"QVariant::load: unknown user type with name %s.",pcVar7);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
      goto LAB_002a3d7a;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  create(this,typeId,(void *)0x0);
  uVar1 = *(ulong *)&(this->d).field_0x18;
  uVar6 = (uVar1 & 0xfffffffffffffffd) + (ulong)((byte)is_null & 1) * 2;
  *(ulong *)&(this->d).field_0x18 = uVar6;
  if (uVar1 < 4) {
    if (s->ver < 0xd) {
      local_68.context.version = 0;
      local_68.context.line = 0;
      local_68.context.file._0_4_ = 0;
      local_68.context.file._4_4_ = 0;
      local_68.context.function._0_4_ = 0;
      local_68.context.function._4_4_ = 0;
      ::operator>>(s,(QString *)&local_68);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      uVar6 = *(ulong *)&(this->d).field_0x18;
    }
    *(ulong *)&(this->d).field_0x18 = uVar6 | 2;
  }
  else {
    data = this;
    if ((uVar1 & 1) != 0) {
      pPVar2 = (this->d).data.shared;
      data = (QVariant *)
             ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar2->offset);
    }
    local_68.context.version = (int)(uVar1 & 0xfffffffffffffffc);
    local_68.context.line = (int)((uVar1 & 0xfffffffffffffffc) >> 0x20);
    bVar3 = QMetaType::load((QMetaType *)&local_68,s,data);
    if (!bVar3) {
      QDataStream::setStatus(s,ReadCorruptData);
      local_68.context.version = 2;
      local_68.context.function._4_4_ = 0;
      local_68.context.line = 0;
      local_68.context.file._0_4_ = 0;
      local_68.context.file._4_4_ = 0;
      local_68.context.function._0_4_ = 0;
      local_68.context.category = "default";
      local_48.d = (Data *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
      uVar4 = QMetaType::registerHelper((QMetaType *)&local_48);
      QMessageLogger::warning(&local_68,"QVariant::load: unable to load type %d.",(ulong)uVar4);
    }
  }
LAB_002a3d7a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariant::load(QDataStream &s)
{
    clear();

    quint32 typeId;
    s >> typeId;
    if (s.version() < QDataStream::Qt_4_0) {
        // map to Qt 5 ids
        if (typeId >= MapFromThreeCount)
            return;
        typeId = mapIdFromQt3ToCurrent[typeId];
    } else if (s.version() < QDataStream::Qt_5_0) {
        // map to Qt 5 type ids
        if (typeId == 127 /* QVariant::UserType */) {
            typeId = Qt5UserType;
        } else if (typeId >= 128 && typeId != Qt5UserType) {
            // In Qt4 id == 128 was FirstExtCoreType. In Qt5 ExtCoreTypes set was merged to CoreTypes
            // by moving all ids down by 97.
            typeId -= 97;
        } else if (typeId == 75 /* QSizePolicy */) {
            typeId = Qt5SizePolicy;
        } else if (typeId > 75 && typeId <= 86) {
            // and as a result these types received lower ids too
            // QKeySequence QPen QTextLength QTextFormat QTransform QMatrix4x4 QVector2D QVector3D QVector4D QQuaternion
            typeId -=1;
        }
    }
    if (s.version() < QDataStream::Qt_6_0) {
        // map from Qt 5 to Qt 6 values
        if (typeId == Qt5UserType) {
            typeId = QMetaType::User;
        } else if (typeId >= Qt5FirstGuiType && typeId <= Qt5LastGuiType) {
            typeId += Qt6ToQt5GuiTypeDelta;
        } else if (typeId == Qt5SizePolicy) {
            typeId = QMetaType::QSizePolicy;
        } else if (typeId == Qt5RegExp) {
            typeId = QMetaType::fromName("QRegExp").id();
        }
    }

    qint8 is_null = false;
    if (s.version() >= QDataStream::Qt_4_2)
        s >> is_null;
    if (typeId == QMetaType::User) {
        QByteArray name;
        s >> name;
        typeId = QMetaType::fromName(name).id();
        if (typeId == QMetaType::UnknownType) {
            s.setStatus(QDataStream::ReadCorruptData);
            qWarning("QVariant::load: unknown user type with name %s.", name.constData());
            return;
        }
    }
    create(typeId, nullptr);
    d.is_null = is_null;

    if (!isValid()) {
        if (s.version() < QDataStream::Qt_5_0) {
            // Since we wrote something, we should read something
            QString x;
            s >> x;
        }
        d.is_null = true;
        return;
    }

    // const cast is safe since we operate on a newly constructed variant
    void *data = const_cast<void *>(constData());
    if (!d.type().load(s, data)) {
        s.setStatus(QDataStream::ReadCorruptData);
        qWarning("QVariant::load: unable to load type %d.", d.type().id());
    }
}